

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom,REF_INT geom,REF_DBL *delta_radian)

{
  REF_INT *pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  REF_INT RVar7;
  REF_DBL RVar8;
  REF_DBL RVar9;
  double dVar10;
  
  bVar4 = true;
  RVar8 = 0.0;
  if (ref_geom->face_seg_per_rad == (REF_DBL *)0x0) {
    bVar3 = true;
  }
  else {
    pRVar1 = ref_geom->descr;
    iVar5 = pRVar1[(long)(geom * 6) + 5];
    RVar7 = -1;
    uVar6 = 0xffffffff;
    if (-1 < (long)iVar5) {
      uVar6 = 0xffffffff;
      if (iVar5 < ref_geom->ref_adj->nnode) {
        uVar6 = (ulong)(uint)ref_geom->ref_adj->first[iVar5];
      }
    }
    iVar5 = (int)uVar6;
    if (iVar5 != -1) {
      RVar7 = ref_geom->ref_adj->item[iVar5].ref;
    }
    bVar3 = true;
    if (iVar5 != -1) {
      bVar3 = false;
      do {
        if ((pRVar1[RVar7 * 6] == 2) &&
           (dVar10 = ref_geom->face_seg_per_rad[(long)pRVar1[(int)(RVar7 * 6 | 1)] + -1],
           -998.0 <= dVar10)) {
          if (dVar10 <= 0.01) {
            bVar4 = false;
            goto LAB_00134baa;
          }
          if (RVar8 <= dVar10) {
            RVar8 = dVar10;
          }
          bVar3 = true;
        }
        pRVar2 = ref_geom->ref_adj->item;
        iVar5 = pRVar2[(int)uVar6].next;
        uVar6 = (ulong)iVar5;
        if (uVar6 == 0xffffffffffffffff) {
          RVar7 = -1;
        }
        else {
          RVar7 = pRVar2[uVar6].ref;
        }
      } while (iVar5 != -1);
      bVar4 = true;
LAB_00134baa:
      bVar3 = !bVar3;
    }
  }
  RVar9 = 100.0;
  if (bVar4) {
    if (bVar3) {
      RVar8 = ref_geom->segments_per_radian_of_curvature;
    }
    if (0.1 < RVar8) {
      dVar10 = RVar8 * 1e+20;
      if (dVar10 <= -dVar10) {
        dVar10 = -dVar10;
      }
      if (1.0 < dVar10) {
        RVar9 = 1.0 / RVar8;
      }
    }
  }
  *delta_radian = RVar9;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom, REF_INT geom,
                                           REF_DBL *delta_radian) {
  REF_INT node, item, face_geom, face;
  REF_DBL segments, face_segments;
  REF_DBL face_set = -998.0;
  REF_DBL face_active = 0.01;
  REF_BOOL turn_off, use_face;
  use_face = REF_FALSE;
  turn_off = REF_FALSE;

  segments = 0.0;

  if (NULL != (ref_geom)->face_seg_per_rad) {
    node = ref_geom_node(ref_geom, geom);
    each_ref_geom_having_node(ref_geom, node, item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        face = ref_geom_id(ref_geom, face_geom) - 1;
        face_segments = ref_geom->face_seg_per_rad[face];
        if (face_segments < face_set) continue;
        if (face_segments > face_active) {
          segments = MAX(segments, face_segments);
          use_face = REF_TRUE;
        } else {
          turn_off = REF_TRUE;
          break;
        }
      }
    }
  }

  if (turn_off) {
    *delta_radian = 100.0;
    return REF_SUCCESS;
  }

  if (!use_face) {
    segments = ref_geom_segments_per_radian_of_curvature(ref_geom);
  }

  if (segments > 0.1 && ref_math_divisible(1.0, segments)) {
    *delta_radian = 1.0 / segments;
  } else {
    *delta_radian = 100.0;
  }

  return REF_SUCCESS;
}